

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsGetArrayValuesFunction(JsValueRef *result)

{
  ScriptContext *pSVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext;
  JavascriptFunction *pJVar3;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  currentContext = JsrtContext::GetCurrent();
  JVar2 = CheckContext(currentContext,false,true);
  if (JVar2 == JsNoError) {
    pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
             ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (result == (JsValueRef *)0x0) {
      JVar2 = JsErrorNullArgument;
    }
    else {
      pJVar3 = Js::JavascriptLibrary::EnsureArrayPrototypeValuesFunction
                         ((pSVar1->super_ScriptContextBase).javascriptLibrary);
      *result = pJVar3;
      JVar2 = JsNoError;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsGetArrayValuesFunction(_Out_ JsValueRef * result)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(result);

        *result = scriptContext->GetLibrary()->EnsureArrayPrototypeValuesFunction();

        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}